

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O2

PaError PaUtil_CancelThreading(PaUtilThreading *threading,int wait,PaError *exitResult)

{
  PaError *in_RAX;
  void *pret;
  PaError *local_18;
  
  if (exitResult != (PaError *)0x0) {
    *exitResult = 0;
  }
  local_18 = in_RAX;
  if (wait == 0) {
    pthread_cancel(threading->callbackThread);
  }
  pthread_join(threading->callbackThread,&local_18);
  if (1 < (long)local_18 + 1U) {
    if (exitResult != (PaError *)0x0) {
      *exitResult = *local_18;
    }
    free(local_18);
  }
  return 0;
}

Assistant:

PaError PaUtil_CancelThreading( PaUtilThreading *threading, int wait, PaError *exitResult )
{
    PaError result = paNoError;
    void *pret;

    if( exitResult )
        *exitResult = paNoError;

    /* If pthread_cancel is not supported (Android platform) whole this function can lead to indefinite waiting if 
       working thread (callbackThread) has'n received any stop signals from outside, please keep 
       this in mind when considering using PaUtil_CancelThreading
    */
#ifdef PTHREAD_CANCELED
    /* Only kill the thread if it isn't in the process of stopping (flushing adaptation buffers) */
    if( !wait )
        pthread_cancel( threading->callbackThread );   /* XXX: Safe to call this if the thread has exited on its own? */
#endif
    pthread_join( threading->callbackThread, &pret );

#ifdef PTHREAD_CANCELED
    if( pret && PTHREAD_CANCELED != pret )
#else
    /* !wait means the thread may have been canceled */
    if( pret && wait )
#endif
    {
        if( exitResult )
            *exitResult = *(PaError *) pret;
        free( pret );
    }

    return result;
}